

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O2

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this)

{
  IRKind IVar1;
  undefined2 uVar2;
  uint uVar3;
  SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  code *pcVar5;
  byte bVar6;
  byte bVar7;
  NodeBase *this_00;
  bool bVar8;
  bool bVar9;
  IRType IVar10;
  undefined4 *puVar11;
  LabelInstr *pLVar12;
  Type *ppBVar13;
  Instr *pIVar14;
  BranchInstr *pBVar15;
  AddrOpnd *pAVar16;
  RegOpnd *pRVar17;
  byte bVar18;
  char *message;
  char *error;
  uint lineNumber;
  Type this_01;
  Opnd *this_02;
  LabelInstr *this_03;
  Instr *this_04;
  bool bVar19;
  undefined1 local_68 [8];
  Iterator __iter;
  
  if (DAT_014303d8 == '\x01') {
    bVar19 = (this->func->field_0x243 & 1) == 0;
  }
  else {
    bVar19 = false;
  }
  this_04 = this->func->m_headInstr;
  __iter.current = (NodeBase *)this;
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  bVar7 = 0;
LAB_003eae97:
  pIVar14 = this_04;
  if (pIVar14 == (Instr *)0x0) {
    return;
  }
  this_04 = pIVar14->m_next;
  bVar8 = Lowerer::ValidOpcodeAfterLower(pIVar14,(Func *)(__iter.current)->next);
  if (!bVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0x11,"(Lowerer::ValidOpcodeAfterLower(instr, this->func))",
                       "Lowerer::ValidOpcodeAfterLower(instr, this->func)");
    if (!bVar8) goto LAB_003eb6a2;
    *puVar11 = 0;
  }
  LowererMD::Legalize<true>(pIVar14,false);
  this_00 = __iter.current;
  IVar1 = pIVar14->m_kind;
  if (IVar1 == InstrKindBranch) goto LAB_003eb14f;
  if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
    pLVar12 = IR::Instr::AsLabelInstr(pIVar14);
    bVar18 = (pLVar12->field_0x78 & 2) >> 1;
    bVar7 = bVar18;
    if ((bool)((pLVar12->field_0x78 & 2) == 0 & bVar19)) {
      pLVar12 = IR::Instr::AsLabelInstr(pIVar14);
      bVar7 = 0;
      if ((pLVar12->field_0x78 & 0x20) == 0) {
        pLVar12 = IR::Instr::AsLabelInstr(pIVar14);
        bVar6 = 1;
        bVar8 = false;
        do {
          this_03 = pLVar12;
          local_68 = (undefined1  [8])&this_03->labelRefs;
          __iter.list = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)local_68;
          while( true ) {
            if (__iter.list ==
                (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar9) goto LAB_003eb6a2;
              *puVar11 = 0;
            }
            pSVar4 = (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                     ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            if ((undefined1  [8])pSVar4 == local_68) goto LAB_003eb02b;
            __iter.list = pSVar4;
            ppBVar13 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
                       Data((Iterator *)local_68);
            this_01 = *ppBVar13;
            do {
              this_01 = (Type)(this_01->super_Instr).m_prev;
              if (this_01 == (Type)0x0) goto LAB_003eb023;
              IVar1 = (this_01->super_Instr).m_kind;
            } while ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel));
            pLVar12 = IR::Instr::AsLabelInstr((Instr *)this_01);
            if (((pLVar12->field_0x78 & 2) == 0) ||
               ((*ppBVar13)->m_isHelperToNonHelperBranch == true)) break;
            bVar6 = 0;
          }
LAB_003eb023:
          bVar6 = 0;
          bVar8 = true;
LAB_003eb02b:
          this_04 = (this_03->super_Instr).m_next;
          if ((this_04->m_kind != InstrKindProfiledLabel) && (this_04->m_kind != InstrKindLabel))
          goto LAB_003eb0b5;
          pLVar12 = IR::Instr::AsLabelInstr(this_04);
          if ((((ulong)(__iter.current)->next[0x48].next & 0x800000) == 0) &&
             ((pLVar12->field_0x78 & 0x22) == 2)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0x3a,
                               "(func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper)"
                               ,
                               "func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper"
                              );
            if (!bVar9) goto LAB_003eb6a2;
            *puVar11 = 0;
          }
        } while ((pLVar12->field_0x78 & 2) == 0);
        this_04 = (this_03->super_Instr).m_next;
LAB_003eb0b5:
        bVar7 = bVar18;
        if ((!bVar8) &&
           (pIVar14 = IR::Instr::GetNextRealInstrOrLabel(pIVar14),
           !(bool)(pIVar14->m_kind == InstrKindExit | bVar6))) {
          pIVar14 = IR::Instr::GetPrevRealInstrOrLabel(&this_03->super_Instr);
          bVar8 = IR::Instr::HasFallThrough(pIVar14);
          if ((bVar8) &&
             ((pIVar14->m_kind != InstrKindBranch ||
              (pBVar15 = IR::Instr::AsBranchInstr(pIVar14),
              pBVar15->m_isHelperToNonHelperBranch == false)))) {
            for (; pIVar14 != (Instr *)0x0; pIVar14 = pIVar14->m_prev) {
              if ((pIVar14->m_kind == InstrKindLabel) || (pIVar14->m_kind == InstrKindProfiledLabel)
                 ) {
                pLVar12 = IR::Instr::AsLabelInstr(pIVar14);
                if ((pLVar12->field_0x78 & 2) == 0) goto LAB_003eae97;
                break;
              }
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0x51,
                               "(prevInstr && prevInstr->IsLabelInstr() && !prevInstr->AsLabelInstr()->isOpHelper)"
                               ,"Inconsistency in Helper label annotations");
            goto LAB_003eb5d9;
          }
        }
      }
    }
    goto LAB_003eae97;
  }
  Check((DbCheckPostLower *)__iter.current,pIVar14->m_dst);
  Check((DbCheckPostLower *)this_00,pIVar14->m_src1);
  Check((DbCheckPostLower *)this_00,pIVar14->m_src2);
  bVar8 = EncoderMD::IsOPEQ(pIVar14);
  if (bVar8) {
    bVar8 = IR::Opnd::IsEqual(pIVar14->m_dst,pIVar14->m_src1);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x97,"(instr->GetDst()->IsEqual(instr->GetSrc1()))",
                         "instr->GetDst()->IsEqual(instr->GetSrc1())");
      if (!bVar8) goto LAB_003eb6a2;
      *puVar11 = 0;
    }
    if ((pIVar14->m_src2 != (Opnd *)0x0) &&
       (TySize[pIVar14->m_dst->m_type] != TySize[pIVar14->m_src2->m_type])) {
      bVar8 = EncoderMD::IsSHIFT(pIVar14);
      if ((bVar8) || (uVar2 = pIVar14->m_opcode, (ushort)(uVar2 - 0x3e1) < 3)) {
        this_02 = pIVar14->m_src2;
        IVar10 = this_02->m_type;
        if (TySize[IVar10] == 1) goto LAB_003eb4ce;
      }
      else {
        this_02 = pIVar14->m_src2;
        IVar10 = this_02->m_type;
      }
      if ((((IVar10 != TyVar) || (TySize[pIVar14->m_dst->m_type] != 4)) ||
          (bVar8 = IR::Opnd::IsAddrOpnd(this_02), !bVar8)) ||
         (pAVar16 = IR::Opnd::AsAddrOpnd(pIVar14->m_src2),
         (Var)(long)(int)pAVar16->m_address != pAVar16->m_address)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                           ,0xa0,
                           "(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() || ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR || instr->m_opcode == Js::OpCode::BTS || instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) || (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 && instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address))))"
                           ,
                           "!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() || ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR || instr->m_opcode == Js::OpCode::BTS || instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) || (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 && instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address)))"
                          );
        if (!bVar8) goto LAB_003eb6a2;
        *puVar11 = 0;
      }
    }
  }
LAB_003eb4ce:
  bVar8 = LowererMD::IsAssign(pIVar14);
  if ((bVar8) && (TySize[pIVar14->m_dst->m_type] != TySize[pIVar14->m_src1->m_type])) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0xa7,
                       "(!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize())"
                       ,
                       "!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize()"
                      );
    if (!bVar8) goto LAB_003eb6a2;
    *puVar11 = 0;
  }
  if (pIVar14->m_opcode - 0x3e6 < 0x10) {
    if (pIVar14->m_src2 == (Opnd *)0x0) {
      pRVar17 = IR::Opnd::AsRegOpnd(pIVar14->m_dst);
      if (pRVar17->m_reg == RegNOREG) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        lineNumber = 0xc5;
        error = "(instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG)";
        message = "instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG";
        goto LAB_003eb5d4;
      }
      goto LAB_003eae97;
    }
    bVar8 = IR::Opnd::IsEqual(pIVar14->m_dst,pIVar14->m_src1);
    if (bVar8) goto LAB_003eae97;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    lineNumber = 0xc0;
    error = "(instr->GetDst()->IsEqual(instr->GetSrc1()))";
    message = "instr->GetDst()->IsEqual(instr->GetSrc1())";
  }
  else {
    if ((pIVar14->m_opcode != CALL) ||
       (uVar3 = *(uint *)&pIVar14->m_func->field_0x240, (short)uVar3 < 0 || (uVar3 & 1) != 0))
    goto LAB_003eae97;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    lineNumber = 0xc9;
    error = "(!instr->m_func->IsTrueLeaf())";
    message = "!instr->m_func->IsTrueLeaf()";
  }
  goto LAB_003eb5d4;
LAB_003eb14f:
  if ((!bVar19) || (bVar7 != 0)) goto LAB_003eae97;
  pBVar15 = IR::Instr::AsBranchInstr(pIVar14);
  pLVar12 = pBVar15->m_branchTarget;
  pBVar15 = IR::Instr::AsBranchInstr(pIVar14);
  bVar8 = IR::BranchInstr::IsConditional(pBVar15);
  if (bVar8) {
    if ((pLVar12->field_0x78 & 0x22) != 2) goto LAB_003eae97;
    pIVar14 = IR::Instr::GetNextRealInstrOrLabel(pIVar14);
    if (((pIVar14->m_kind != InstrKindProfiledLabel) && (pIVar14->m_kind != InstrKindLabel)) ||
       (pLVar12 = IR::Instr::AsLabelInstr(pIVar14), (pLVar12->field_0x78 & 2) == 0))
    goto LAB_003eae97;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    lineNumber = 0x62;
    error = "(!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper))";
    message = "!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper)";
  }
  else {
    pBVar15 = IR::Instr::AsBranchInstr(pIVar14);
    bVar8 = IR::BranchInstr::IsUnconditional(pBVar15);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x67,"(instr->AsBranchInstr()->IsUnconditional())",
                         "instr->AsBranchInstr()->IsUnconditional()");
      if (!bVar8) goto LAB_003eb6a2;
      *puVar11 = 0;
    }
    if (pLVar12 == (LabelInstr *)0x0) {
      if (pIVar14->m_src1 != (Opnd *)0x0) goto LAB_003eae97;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      lineNumber = 0x86;
      error = "(instr->GetSrc1())";
      message = "instr->GetSrc1()";
    }
    else {
      if ((pLVar12->field_0x78 & 0x22) != 2) goto LAB_003eae97;
      pIVar14 = pIVar14->m_prev;
      if (((ulong)(__iter.current)->next[0x48].next & 0x400000) != 0) {
        while (bVar8 = LowererMD::IsAssign(pIVar14), bVar8) {
          pIVar14 = pIVar14->m_prev;
        }
      }
      if (pIVar14->m_opcode == DeletedNonHelperBranch) goto LAB_003eae97;
      if (pIVar14->m_kind == InstrKindBranch) {
        pBVar15 = IR::Instr::AsBranchInstr(pIVar14);
        bVar8 = IR::BranchInstr::IsConditional(pBVar15);
        if ((bVar8) &&
           ((pBVar15 = IR::Instr::AsBranchInstr(pIVar14),
            (pBVar15->m_branchTarget->field_0x78 & 2) == 0 ||
            (pBVar15 = IR::Instr::AsBranchInstr(pIVar14),
            (pBVar15->m_branchTarget->field_0x78 & 0x20) != 0)))) goto LAB_003eae97;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      lineNumber = 0x82;
      error = 
      "((instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional() && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert)))"
      ;
      message = 
      "(instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional() && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert))"
      ;
    }
  }
LAB_003eb5d4:
  bVar8 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                     ,lineNumber,error,message);
LAB_003eb5d9:
  if (bVar8 != false) {
    *puVar11 = 0;
    goto LAB_003eae97;
  }
LAB_003eb6a2:
  pcVar5 = (code *)invalidInstructionException();
  (*pcVar5)();
}

Assistant:

void
DbCheckPostLower::Check()
{
    bool doOpHelperCheck = Js::Configuration::Global.flags.CheckOpHelpers && !this->func->isPostLayout;
    bool isInHelperBlock = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        Assert(Lowerer::ValidOpcodeAfterLower(instr, this->func));
        LowererMD::Legalize</*verify*/true>(instr);
        switch(instr->GetKind())
        {
        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
        {
            isInHelperBlock = instr->AsLabelInstr()->isOpHelper;
            if (doOpHelperCheck && !isInHelperBlock && !instr->AsLabelInstr()->m_noHelperAssert)
            {
                bool foundNonHelperPath = false;
                bool isDeadLabel = true;

                IR::LabelInstr* labelInstr = instr->AsLabelInstr();

                while (1)
                {
                    FOREACH_SLIST_ENTRY(IR::BranchInstr *, branchInstr, &labelInstr->labelRefs)
                    {
                        isDeadLabel = false;
                        IR::Instr *instrPrev = branchInstr->m_prev;
                        while (instrPrev && !instrPrev->IsLabelInstr())
                        {
                            instrPrev = instrPrev->m_prev;
                        }
                        if (!instrPrev || !instrPrev->AsLabelInstr()->isOpHelper || branchInstr->m_isHelperToNonHelperBranch)
                        {
                            foundNonHelperPath = true;
                            break;
                        }
                    } NEXT_SLIST_ENTRY;

                    if (!labelInstr->m_next->IsLabelInstr())
                    {
                        break;
                    }
                    IR::LabelInstr *const nextLabel = labelInstr->m_next->AsLabelInstr();

                    // It is generally not expected for a non-helper label to be immediately followed by a helper label. Some
                    // special cases may flag the helper label with m_noHelperAssert = true. Peeps can cause non-helper blocks
                    // to fall through into helper blocks, so skip this check after peeps.
                    Assert(func->isPostPeeps || nextLabel->m_noHelperAssert || !nextLabel->isOpHelper);

                    if(nextLabel->isOpHelper)
                    {
                        break;
                    }
                    labelInstr = nextLabel;
                }

                instrNext = labelInstr->m_next;

                // This label is unreachable or at least one path to it is not from a helper block.

                if (!foundNonHelperPath && !instr->GetNextRealInstrOrLabel()->IsExitInstr() && !isDeadLabel)
                {
                    IR::Instr *prevInstr = labelInstr->GetPrevRealInstrOrLabel();
                    if (prevInstr->HasFallThrough() && !(prevInstr->IsBranchInstr() && prevInstr->AsBranchInstr()->m_isHelperToNonHelperBranch))
                    {
                        while (prevInstr && !prevInstr->IsLabelInstr())
                        {
                            prevInstr = prevInstr->m_prev;
                        }

                        AssertMsg(prevInstr && prevInstr->IsLabelInstr() && !prevInstr->AsLabelInstr()->isOpHelper, "Inconsistency in Helper label annotations");
                    }
                }
            }
            break;
        }
        case IR::InstrKindBranch:
            if (doOpHelperCheck && !isInHelperBlock)
            {
                IR::LabelInstr *targetLabel = instr->AsBranchInstr()->GetTarget();

                // This branch needs a path to a non-helper block.
                if (instr->AsBranchInstr()->IsConditional())
                {
                    if (targetLabel->isOpHelper && !targetLabel->m_noHelperAssert)
                    {
                        IR::Instr *instrNextDebug = instr->GetNextRealInstrOrLabel();
                        Assert(!(instrNextDebug->IsLabelInstr() && instrNextDebug->AsLabelInstr()->isOpHelper));
                    }
                }
                else
                {
                    Assert(instr->AsBranchInstr()->IsUnconditional());

                    if (targetLabel)
                    {
                        if (!targetLabel->isOpHelper || targetLabel->m_noHelperAssert)
                        {
                            break;
                        }
                        // Target is opHelper

                        IR::Instr *instrPrev = instr->m_prev;

                        if (this->func->isPostRegAlloc)
                        {
                            while (LowererMD::IsAssign(instrPrev))
                            {
                                // Skip potential register allocation compensation code
                                instrPrev = instrPrev->m_prev;
                            }
                        }

                        if (instrPrev->m_opcode == Js::OpCode::DeletedNonHelperBranch)
                        {
                            break;
                        }

                        Assert((instrPrev->IsBranchInstr() && instrPrev->AsBranchInstr()->IsConditional()
                            && (!instrPrev->AsBranchInstr()->GetTarget()->isOpHelper || instrPrev->AsBranchInstr()->GetTarget()->m_noHelperAssert)));
                    }
                    else
                    {
                        Assert(instr->GetSrc1());
                    }
                }
            }
            break;

        default:
            this->Check(instr->GetDst());
            this->Check(instr->GetSrc1());
            this->Check(instr->GetSrc2());

#if defined(_M_IX86) || defined(_M_X64)
            // for op-eq's and assignment operators, make  sure the types match
            // for shift operators make sure the types match and the third is an 8-bit immediate
            // for cmp operators similarly check types are same
            if (EncoderMD::IsOPEQ(instr))
            {
                Assert(instr->GetDst()->IsEqual(instr->GetSrc1()));

#if defined(_M_X64)
                Assert(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() ||
                    ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR ||
                        instr->m_opcode == Js::OpCode::BTS ||
                        instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1) ||
                    // Is src2 is TyVar and src1 is TyInt32/TyUint32, make sure the address fits in 32 bits 
                        (instr->GetSrc2()->GetType() == TyVar && instr->GetDst()->GetSize() == 4 &&
                         instr->GetSrc2()->IsAddrOpnd() && Math::FitsInDWord(reinterpret_cast<int64>(instr->GetSrc2()->AsAddrOpnd()->m_address))));
#else
                Assert(!instr->GetSrc2() || instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize() ||
                    ((EncoderMD::IsSHIFT(instr) || instr->m_opcode == Js::OpCode::BTR ||
                        instr->m_opcode == Js::OpCode::BT) && instr->GetSrc2()->GetSize() == 1));
#endif
            }
            Assert(!LowererMD::IsAssign(instr) || instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize());
            Assert(instr->m_opcode != Js::OpCode::CMP || instr->GetSrc1()->GetType() == instr->GetSrc1()->GetType());

            switch (instr->m_opcode)
            {
            case Js::OpCode::CMOVA:
            case Js::OpCode::CMOVAE:
            case Js::OpCode::CMOVB:
            case Js::OpCode::CMOVBE:
            case Js::OpCode::CMOVE:
            case Js::OpCode::CMOVG:
            case Js::OpCode::CMOVGE:
            case Js::OpCode::CMOVL:
            case Js::OpCode::CMOVLE:
            case Js::OpCode::CMOVNE:
            case Js::OpCode::CMOVNO:
            case Js::OpCode::CMOVNP:
            case Js::OpCode::CMOVNS:
            case Js::OpCode::CMOVO:
            case Js::OpCode::CMOVP:
            case Js::OpCode::CMOVS:
                if (instr->GetSrc2())
                {
                    // CMOV inserted before regAlloc need a fake use of the dst register to make up for the
                    // fact that the CMOV may not set the dst. Regalloc needs to assign the same physical register for dst and src1.
                    Assert(instr->GetDst()->IsEqual(instr->GetSrc1()));
                }
                else
                {
                    // These must have been inserted post-regalloc.
                    Assert(instr->GetDst()->AsRegOpnd()->GetReg() != RegNOREG);
                }
                break;
            case Js::OpCode::CALL:
                Assert(!instr->m_func->IsTrueLeaf());
                break;
            }
#endif
        }
    } NEXT_INSTR_IN_FUNC_EDITING;
}